

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_set.c
# Opt level: O1

int mpt_reply_set(mpt_reply_data *rd,size_t len,void *data)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = rd->_max;
  iVar2 = -2;
  if (len <= uVar1) {
    if (data == (void *)0x0) {
      memset(rd->val,0,len);
    }
    else {
      memcpy(rd->val,data,len);
    }
    rd->len = (uint16_t)len;
    iVar2 = (uint)uVar1 - (int)len;
  }
  return iVar2;
}

Assistant:

extern int mpt_reply_set(MPT_INTERFACE(reply_data) *rd, size_t len, const void *data)
{
	if (len > rd->_max) {
		return MPT_ERROR(BadValue);
	}
	if (data) {
		memcpy(rd->val, data, len);
	} else {
		memset(rd->val, 0, len);
	}
	rd->len = len;
	
	return rd->_max - len;
}